

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EnumType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::EnumType,slang::ast::Compilation&,slang::SourceLocation_const&,slang::ast::Type_const&,slang::ast::ASTContext&>
          (BumpAllocator *this,Compilation *args,SourceLocation *args_1,Type *args_2,
          ASTContext *args_3)

{
  EnumType *this_00;
  
  this_00 = (EnumType *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EnumType *)this->endPtr < this_00 + 1) {
    this_00 = (EnumType *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::EnumType::EnumType(this_00,args,*args_1,args_2,args_3);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }